

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O0

void __thiscall YdiskRestClient::_do_download(YdiskRestClient *this,string *url,ofstream *ofstream)

{
  bool bVar1;
  const_reference pvVar2;
  runtime_error *prVar3;
  char *host;
  Progress *progress;
  element_type *peVar4;
  element_type *peVar5;
  long lVar6;
  string local_1c8;
  function<bool_(unsigned_long,_unsigned_long)> local_1a8;
  undefined1 local_188 [8];
  shared_ptr<httplib::Response> r2;
  SSLClient cli2;
  string_type local_d0;
  undefined1 local_b0 [8];
  regex pattern;
  undefined1 local_80 [8];
  smatch m;
  string request_url;
  string server_url;
  ofstream *ofstream_local;
  string *url_local;
  YdiskRestClient *this_local;
  
  std::__cxx11::string::string((string *)(request_url.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&m._M_begin);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)local_80);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_b0,"https://(.+?)(/.+)",
             0x10);
  bVar1 = std::
          regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (url,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_80,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_b0,0);
  if (!bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Error parsing file href for download");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar2 = std::__cxx11::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)local_80,1);
  std::__cxx11::
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::str(&local_d0,pvVar2);
  std::__cxx11::string::operator=
            ((string *)(request_url.field_2._M_local_buf + 8),(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  pvVar2 = std::__cxx11::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)local_80,2);
  std::__cxx11::
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::str((string_type *)&cli2.ctx_mutex_.super___mutex_base._M_mutex.__data.__list.__next,pvVar2);
  std::__cxx11::string::operator=
            ((string *)&m._M_begin,
             (string *)&cli2.ctx_mutex_.super___mutex_base._M_mutex.__data.__list.__next);
  std::__cxx11::string::~string
            ((string *)&cli2.ctx_mutex_.super___mutex_base._M_mutex.__data.__list.__next);
  host = (char *)std::__cxx11::string::c_str();
  httplib::SSLClient::SSLClient
            ((SSLClient *)
             &r2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount,host,
             0x1bb,300);
  progress = (Progress *)std::__cxx11::string::c_str();
  std::function<bool_(unsigned_long,_unsigned_long)>::function(&local_1a8,(nullptr_t)0x0);
  httplib::Client::Get
            ((Client *)local_188,
             (char *)&r2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,progress);
  std::function<bool_(unsigned_long,_unsigned_long)>::~function(&local_1a8);
  peVar4 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_188);
  if ((peVar4 == (element_type *)0x0) ||
     (peVar5 = std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_188), peVar5->status != 200)) {
    peVar4 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_188);
    if ((peVar4 == (element_type *)0x0) ||
       (peVar5 = std::
                 __shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_188), peVar5->status != 0x12e)) {
      peVar4 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_188);
      throw_response_error(this,peVar4);
    }
    else {
      peVar5 = std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_188);
      bVar1 = httplib::Response::has_header(peVar5,"Location");
      if (!bVar1) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"Cannot find redirect link");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      peVar5 = std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_188);
      httplib::Response::get_header_value_abi_cxx11_(&local_1c8,peVar5,"Location",0);
      _do_download(this,&local_1c8,ofstream);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
  }
  else {
    std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_188);
    lVar6 = std::__cxx11::string::data();
    std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_188);
    std::__cxx11::string::size();
    std::ostream::write((char *)ofstream,lVar6);
  }
  std::shared_ptr<httplib::Response>::~shared_ptr((shared_ptr<httplib::Response> *)local_188);
  httplib::SSLClient::~SSLClient
            ((SSLClient *)
             &r2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_b0);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)local_80);
  std::__cxx11::string::~string((string *)&m._M_begin);
  std::__cxx11::string::~string((string *)(request_url.field_2._M_local_buf + 8));
  return;
}

Assistant:

void YdiskRestClient::_do_download(std::string url, std::ofstream &ofstream){
    std::string server_url, request_url;

    std::smatch m;
    auto pattern = std::regex("https://(.+?)(/.+)");
    if (std::regex_search(url, m, pattern)) {
        server_url = m[1].str();
        request_url = m[2].str();
    } else {
        throw std::runtime_error("Error parsing file href for download");
    }

    httplib::SSLClient cli2(server_url.c_str());
    auto r2 = cli2.Get(request_url.c_str());
    if(r2.get() && r2->status == 200){
        ofstream.write(r2->body.data(), r2->body.size());
    } else if(r2.get() && r2->status == 302){ //redirect
        if(r2->has_header("Location"))
            _do_download(r2->get_header_value("Location"), ofstream);
        else
            throw std::runtime_error("Cannot find redirect link");
    } else {
        throw_response_error(r2.get());
    }
}